

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

int hts_idx_load_core(hts_idx_t *idx,void *fp,int fmt)

{
  int iVar1;
  lidx_t *plVar2;
  khint_t kVar3;
  kh_bin_t *pkVar4;
  long lVar5;
  hts_pair64_t *buf;
  uint64_t *puVar6;
  uint is_bgzf;
  int iVar7;
  bins_t *pbVar8;
  int absent;
  uint32_t key;
  int32_t n;
  lidx_t *local_50;
  long local_48;
  hts_idx_t *local_40;
  kh_bin_t *local_38;
  
  if (idx == (hts_idx_t *)0x0) {
    iVar7 = -4;
  }
  else {
    lVar5 = 0;
    local_40 = idx;
    while( true ) {
      iVar7 = -1;
      is_bgzf = (uint)(fmt != 1);
      if (idx->n <= lVar5) break;
      local_50 = idx->lidx + lVar5;
      pkVar4 = kh_init_bin();
      idx->bidx[lVar5] = pkVar4;
      local_48 = lVar5;
      lVar5 = idx_read(is_bgzf,fp,&n,4);
      local_38 = pkVar4;
      if (lVar5 != 4) {
        return -1;
      }
      while (pkVar4 = local_38, idx = local_40, plVar2 = local_50, iVar7 = iVar7 + 1, iVar7 < n) {
        lVar5 = idx_read(is_bgzf,fp,&key,4);
        if (lVar5 != 4) {
          return -1;
        }
        kVar3 = kh_put_bin(pkVar4,key,&absent);
        if (absent < 1) {
          return -3;
        }
        pbVar8 = pkVar4->vals;
        puVar6 = &pbVar8[kVar3].loff;
        if (fmt == 0) {
          lVar5 = idx_read(is_bgzf,fp,puVar6,8);
          if (lVar5 != 8) {
            return -1;
          }
        }
        else {
          *puVar6 = 0;
        }
        pbVar8 = pbVar8 + kVar3;
        lVar5 = idx_read(is_bgzf,fp,&pbVar8->n,4);
        if (lVar5 != 4) {
          return -1;
        }
        iVar1 = pbVar8->n;
        pbVar8->m = iVar1;
        buf = (hts_pair64_t *)malloc((long)iVar1 << 4);
        pbVar8->list = buf;
        if (buf == (hts_pair64_t *)0x0) {
          return -2;
        }
        lVar5 = idx_read(is_bgzf,fp,buf,(long)(iVar1 << 4));
        if (lVar5 != pbVar8->n << 4) {
          return -1;
        }
      }
      if (fmt != 0) {
        lVar5 = idx_read(is_bgzf,fp,local_50,4);
        if (lVar5 != 4) {
          return -1;
        }
        iVar7 = plVar2->n;
        plVar2->m = iVar7;
        puVar6 = (uint64_t *)malloc((long)iVar7 << 3);
        plVar2->offset = puVar6;
        if (puVar6 == (uint64_t *)0x0) {
          return -2;
        }
        lVar5 = idx_read(is_bgzf,fp,puVar6,(long)(iVar7 * 8));
        iVar7 = local_50->n;
        if (lVar5 != iVar7 * 8) {
          return -1;
        }
        for (lVar5 = 1; lVar5 < iVar7; lVar5 = lVar5 + 1) {
          puVar6 = local_50->offset;
          if (puVar6[lVar5] == 0) {
            puVar6[lVar5] = puVar6[lVar5 + -1];
          }
        }
        update_loff(idx,(int)local_48,1);
      }
      lVar5 = local_48 + 1;
    }
    lVar5 = idx_read(is_bgzf,fp,&idx->n_no_coor,8);
    iVar7 = 0;
    if (lVar5 != 8) {
      idx->n_no_coor = 0;
    }
  }
  return iVar7;
}

Assistant:

static int hts_idx_load_core(hts_idx_t *idx, void *fp, int fmt)
{
    int32_t i, n, is_be;
    int is_bgzf = (fmt != HTS_FMT_BAI);
    is_be = ed_is_big();
    if (idx == NULL) return -4;
    for (i = 0; i < idx->n; ++i) {
        bidx_t *h;
        lidx_t *l = &idx->lidx[i];
        uint32_t key;
        int j, absent;
        bins_t *p;
        h = idx->bidx[i] = kh_init(bin);
        if (idx_read(is_bgzf, fp, &n, 4) != 4) return -1;
        if (is_be) ed_swap_4p(&n);
        for (j = 0; j < n; ++j) {
            khint_t k;
            if (idx_read(is_bgzf, fp, &key, 4) != 4) return -1;
            if (is_be) ed_swap_4p(&key);
            k = kh_put(bin, h, key, &absent);
            if (absent <= 0) return -3; // Duplicate bin number
            p = &kh_val(h, k);
            if (fmt == HTS_FMT_CSI) {
                if (idx_read(is_bgzf, fp, &p->loff, 8) != 8) return -1;
                if (is_be) ed_swap_8p(&p->loff);
            } else p->loff = 0;
            if (idx_read(is_bgzf, fp, &p->n, 4) != 4) return -1;
            if (is_be) ed_swap_4p(&p->n);
            p->m = p->n;
            p->list = (hts_pair64_t*)malloc(p->m * sizeof(hts_pair64_t));
            if (p->list == NULL) return -2;
            if (idx_read(is_bgzf, fp, p->list, p->n<<4) != p->n<<4) return -1;
            if (is_be) swap_bins(p);
        }
        if (fmt != HTS_FMT_CSI) { // load linear index
            int j;
            if (idx_read(is_bgzf, fp, &l->n, 4) != 4) return -1;
            if (is_be) ed_swap_4p(&l->n);
            l->m = l->n;
            l->offset = (uint64_t*)malloc(l->n * sizeof(uint64_t));
            if (l->offset == NULL) return -2;
            if (idx_read(is_bgzf, fp, l->offset, l->n << 3) != l->n << 3) return -1;
            if (is_be) for (j = 0; j < l->n; ++j) ed_swap_8p(&l->offset[j]);
            for (j = 1; j < l->n; ++j) // fill missing values; may happen given older samtools and tabix
                if (l->offset[j] == 0) l->offset[j] = l->offset[j-1];
            update_loff(idx, i, 1);
        }
    }
    if (idx_read(is_bgzf, fp, &idx->n_no_coor, 8) != 8) idx->n_no_coor = 0;
    if (is_be) ed_swap_8p(&idx->n_no_coor);
    return 0;
}